

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtils.h
# Opt level: O0

void iDynTree::printVectorDifference<iDynTree::VectorFixSize<6u>,iDynTree::VectorFixSize<6u>>
               (string *name,VectorFixSize<6U> *vec1,VectorFixSize<6U> *vec2)

{
  ostream *poVar1;
  size_t sVar2;
  double *pdVar3;
  VectorFixSize<6U> *in_RDX;
  VectorFixSize<6U> *in_RSI;
  string *in_RDI;
  double dVar4;
  double dVar5;
  uint i;
  size_t minSize;
  double local_38;
  double local_30;
  uint local_24;
  ulong local_20;
  VectorFixSize<6U> *local_18;
  VectorFixSize<6U> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  poVar1 = std::operator<<((ostream *)&std::cerr,in_RDI);
  std::operator<<(poVar1," : \n");
  local_20 = VectorFixSize<6U>::size(local_10);
  sVar2 = VectorFixSize<6U>::size(local_18);
  if (sVar2 < local_20) {
    local_20 = VectorFixSize<6U>::size(local_18);
  }
  for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
    dVar4 = VectorFixSize<6U>::operator()(local_10,(ulong)local_24);
    dVar5 = VectorFixSize<6U>::operator()(local_18,(ulong)local_24);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,dVar4 - dVar5);
    poVar1 = std::operator<<(poVar1," ( ");
    dVar4 = VectorFixSize<6U>::operator()(local_10,(ulong)local_24);
    dVar5 = VectorFixSize<6U>::operator()(local_18,(ulong)local_24);
    local_30 = VectorFixSize<6U>::operator()(local_10,(ulong)local_24);
    local_38 = VectorFixSize<6U>::operator()(local_18,(ulong)local_24);
    pdVar3 = std::max<double>(&local_30,&local_38);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(dVar4 - dVar5) / *pdVar3);
    poVar1 = std::operator<<(poVar1," ) ");
    std::operator<<(poVar1,"\n");
  }
  return;
}

Assistant:

void printVectorDifference(std::string name, const VectorType1& vec1, const VectorType2& vec2)
    {
        std::cerr << name << " : \n";
        size_t minSize = vec1.size();

        if( vec2.size() < minSize )
        {
            minSize = vec2.size();
        }

        for(unsigned int i=0; i < minSize; i++ )
        {
            std::cerr << vec1(i) - vec2(i) << " ( " << (vec1(i) - vec2(i))/std::max(vec1(i),vec2(i)) << " ) " << "\n";
        }
    }